

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O3

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterX(SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *tol)

{
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int32_t iVar4;
  int iVar5;
  DataKey DVar6;
  undefined8 uVar7;
  DataKey DVar8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  bestCo;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  best;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_418;
  cpp_dec_float<50U,_int,_void> local_3d8;
  cpp_dec_float<50U,_int,_void> local_398;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_358;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_318;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_298;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_258;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_198;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_158;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_118;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_98;
  cpp_dec_float<50U,_int,_void> local_58;
  
  local_3d8.fpclass = cpp_dec_float_finite;
  local_3d8.prec_elem = 10;
  local_3d8.data._M_elems[0] = 0;
  local_3d8.data._M_elems[1] = 0;
  local_3d8.data._M_elems[2] = 0;
  local_3d8.data._M_elems[3] = 0;
  local_3d8.data._M_elems[4] = 0;
  local_3d8.data._M_elems[5] = 0;
  local_3d8.data._M_elems._24_5_ = 0;
  local_3d8.data._M_elems[7]._1_3_ = 0;
  local_3d8.data._M_elems._32_5_ = 0;
  local_3d8._37_8_ = 0;
  local_418.fpclass = cpp_dec_float_finite;
  local_418.prec_elem = 10;
  local_418.data._M_elems[0] = 0;
  local_418.data._M_elems[1] = 0;
  local_418.data._M_elems[2] = 0;
  local_418.data._M_elems[3] = 0;
  local_418.data._M_elems[4] = 0;
  local_418.data._M_elems[5] = 0;
  local_418.data._M_elems._24_5_ = 0;
  local_418.data._M_elems[7]._1_3_ = 0;
  local_418.data._M_elems._32_5_ = 0;
  local_418.data._M_elems[9]._1_3_ = 0;
  local_418.exp = 0;
  local_418.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&local_3d8,0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&local_418,0);
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&this->last,1.0);
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&this->last,1.0);
  pSVar1 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  if ((pSVar1->hyperPricingEnter == true) && (this->refined == false)) {
    if (((this->bestPrices).super_IdxSet.num < 2) ||
       ((pSVar1->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).updateCount == 0)) {
      if (pSVar1->sparsePricingEnter != true) {
        uVar7 = *(undefined8 *)((tol->m_backend).data._M_elems + 8);
        pnVar9 = &local_d8;
        goto LAB_00298d9c;
      }
      local_98.m_backend.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8);
      local_98.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
      local_98.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
      local_98.m_backend.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4);
      local_98.m_backend.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6);
      local_98.m_backend.exp = (tol->m_backend).exp;
      local_98.m_backend.neg = (tol->m_backend).neg;
      local_98.m_backend.fpclass = (tol->m_backend).fpclass;
      local_98.m_backend.prec_elem = (tol->m_backend).prec_elem;
      DVar6 = (DataKey)buildBestPriceVectorEnterDim
                                 (this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&local_3d8,&local_98);
    }
    else if (pSVar1->sparsePricingEnter == true) {
      local_118.m_backend.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8)
      ;
      local_118.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
      local_118.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
      local_118.m_backend.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4)
      ;
      local_118.m_backend.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6)
      ;
      local_118.m_backend.exp = (tol->m_backend).exp;
      local_118.m_backend.neg = (tol->m_backend).neg;
      local_118.m_backend.fpclass = (tol->m_backend).fpclass;
      local_118.m_backend.prec_elem = (tol->m_backend).prec_elem;
      DVar6 = (DataKey)selectEnterHyperDim(this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                 *)&local_3d8,&local_118);
    }
    else {
      uVar7 = *(undefined8 *)((tol->m_backend).data._M_elems + 8);
      pnVar9 = &local_158;
LAB_00298d9c:
      *(undefined8 *)((pnVar9->m_backend).data._M_elems + 8) = uVar7;
      uVar7 = *(undefined8 *)(tol->m_backend).data._M_elems;
      uVar2 = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
      uVar3 = *(undefined8 *)((tol->m_backend).data._M_elems + 6);
      *(undefined8 *)((pnVar9->m_backend).data._M_elems + 4) =
           *(undefined8 *)((tol->m_backend).data._M_elems + 4);
      *(undefined8 *)((pnVar9->m_backend).data._M_elems + 6) = uVar3;
      *(undefined8 *)(pnVar9->m_backend).data._M_elems = uVar7;
      *(undefined8 *)((pnVar9->m_backend).data._M_elems + 2) = uVar2;
      (pnVar9->m_backend).exp = (tol->m_backend).exp;
      (pnVar9->m_backend).neg = (tol->m_backend).neg;
      iVar4 = (tol->m_backend).prec_elem;
      (pnVar9->m_backend).fpclass = (tol->m_backend).fpclass;
      (pnVar9->m_backend).prec_elem = iVar4;
      DVar6 = (DataKey)selectEnterDenseDim(this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                 *)&local_3d8,pnVar9,0,1);
    }
    pSVar1 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    if (((this->bestPricesCo).super_IdxSet.num < 2) ||
       ((pSVar1->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).updateCount == 0)) {
      if (pSVar1->sparsePricingEnterCo == true) {
        local_198.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 8);
        local_198.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
        local_198.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 2);
        local_198.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 4);
        local_198.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 6);
        local_198.m_backend.exp = (tol->m_backend).exp;
        local_198.m_backend.neg = (tol->m_backend).neg;
        local_198.m_backend.fpclass = (tol->m_backend).fpclass;
        local_198.m_backend.prec_elem = (tol->m_backend).prec_elem;
        DVar8 = (DataKey)buildBestPriceVectorEnterCoDim
                                   (this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_418,&local_198);
        goto LAB_00298e92;
      }
      uVar7 = *(undefined8 *)((tol->m_backend).data._M_elems + 8);
      pnVar9 = &local_1d8;
    }
    else {
      if (pSVar1->sparsePricingEnterCo == true) {
        local_218.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 8);
        local_218.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
        local_218.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 2);
        local_218.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 4);
        local_218.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 6);
        local_218.m_backend.exp = (tol->m_backend).exp;
        local_218.m_backend.neg = (tol->m_backend).neg;
        local_218.m_backend.fpclass = (tol->m_backend).fpclass;
        local_218.m_backend.prec_elem = (tol->m_backend).prec_elem;
        DVar8 = (DataKey)selectEnterHyperCoDim
                                   (this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_418,&local_218);
        goto LAB_00298e92;
      }
      uVar7 = *(undefined8 *)((tol->m_backend).data._M_elems + 8);
      pnVar9 = &local_258;
    }
  }
  else {
    if ((pSVar1->sparsePricingEnter == true) && (this->refined == false)) {
      local_298.m_backend.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8)
      ;
      local_298.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
      local_298.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
      local_298.m_backend.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4)
      ;
      local_298.m_backend.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6)
      ;
      local_298.m_backend.exp = (tol->m_backend).exp;
      local_298.m_backend.neg = (tol->m_backend).neg;
      local_298.m_backend.fpclass = (tol->m_backend).fpclass;
      local_298.m_backend.prec_elem = (tol->m_backend).prec_elem;
      DVar6 = (DataKey)selectEnterSparseDim
                                 (this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&local_3d8,&local_298);
    }
    else {
      local_2d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8)
      ;
      local_2d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
      local_2d8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
      local_2d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4)
      ;
      local_2d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6)
      ;
      local_2d8.m_backend.exp = (tol->m_backend).exp;
      local_2d8.m_backend.neg = (tol->m_backend).neg;
      local_2d8.m_backend.fpclass = (tol->m_backend).fpclass;
      local_2d8.m_backend.prec_elem = (tol->m_backend).prec_elem;
      DVar6 = (DataKey)selectEnterDenseDim(this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                 *)&local_3d8,&local_2d8,0,1);
    }
    if ((((this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thesolver)->sparsePricingEnterCo == true) && (this->refined == false)) {
      local_318.m_backend.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8)
      ;
      local_318.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
      local_318.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
      local_318.m_backend.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4)
      ;
      local_318.m_backend.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6)
      ;
      local_318.m_backend.exp = (tol->m_backend).exp;
      local_318.m_backend.neg = (tol->m_backend).neg;
      local_318.m_backend.fpclass = (tol->m_backend).fpclass;
      local_318.m_backend.prec_elem = (tol->m_backend).prec_elem;
      DVar8 = (DataKey)selectEnterSparseCoDim
                                 (this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&local_418,&local_318);
      goto LAB_00298e92;
    }
    uVar7 = *(undefined8 *)((tol->m_backend).data._M_elems + 8);
    pnVar9 = &local_358;
  }
  *(undefined8 *)((pnVar9->m_backend).data._M_elems + 8) = uVar7;
  uVar7 = *(undefined8 *)(tol->m_backend).data._M_elems;
  uVar2 = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
  uVar3 = *(undefined8 *)((tol->m_backend).data._M_elems + 6);
  *(undefined8 *)((pnVar9->m_backend).data._M_elems + 4) =
       *(undefined8 *)((tol->m_backend).data._M_elems + 4);
  *(undefined8 *)((pnVar9->m_backend).data._M_elems + 6) = uVar3;
  *(undefined8 *)(pnVar9->m_backend).data._M_elems = uVar7;
  *(undefined8 *)((pnVar9->m_backend).data._M_elems + 2) = uVar2;
  (pnVar9->m_backend).exp = (tol->m_backend).exp;
  (pnVar9->m_backend).neg = (tol->m_backend).neg;
  iVar4 = (tol->m_backend).prec_elem;
  (pnVar9->m_backend).fpclass = (tol->m_backend).fpclass;
  (pnVar9->m_backend).prec_elem = iVar4;
  DVar8 = (DataKey)selectEnterDenseCoDim
                             (this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&local_418,pnVar9,0,1);
LAB_00298e92:
  if (DVar6.info != 0) {
    local_58.fpclass = cpp_dec_float_finite;
    local_58.prec_elem = 10;
    local_58.data._M_elems[0] = 0;
    local_58.data._M_elems[1] = 0;
    local_58.data._M_elems[2] = 0;
    local_58.data._M_elems[3] = 0;
    local_58.data._M_elems[4] = 0;
    local_58.data._M_elems[5] = 0;
    local_58.data._M_elems._24_5_ = 0;
    local_58.data._M_elems[7]._1_3_ = 0;
    local_58.data._M_elems._32_5_ = 0;
    local_58._37_8_ = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_58,0.8);
    local_398.data._M_elems[7]._1_3_ = local_418.data._M_elems[7]._1_3_;
    local_398.data._M_elems._24_5_ = local_418.data._M_elems._24_5_;
    local_398.data._M_elems[0] = local_418.data._M_elems[0];
    local_398.data._M_elems[1] = local_418.data._M_elems[1];
    local_398.data._M_elems[2] = local_418.data._M_elems[2];
    local_398.data._M_elems[3] = local_418.data._M_elems[3];
    local_398.data._M_elems[4] = local_418.data._M_elems[4];
    local_398.data._M_elems[5] = local_418.data._M_elems[5];
    local_398.data._M_elems[9]._1_3_ = local_418.data._M_elems[9]._1_3_;
    local_398.data._M_elems._32_5_ = local_418.data._M_elems._32_5_;
    local_398.exp = local_418.exp;
    local_398.neg = local_418.neg;
    local_398.fpclass = local_418.fpclass;
    local_398.prec_elem = local_418.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_398,&local_58)
    ;
    if (((local_3d8.fpclass != cpp_dec_float_NaN) && (local_398.fpclass != cpp_dec_float_NaN)) &&
       (iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_3d8,&local_398), 0 < iVar5)) {
      return (SPxId)DVar6;
    }
    if (DVar8.info == 0) {
      return (SPxId)DVar6;
    }
  }
  return (SPxId)DVar8;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterX(R tol)
{
   SPxId enterId;
   SPxId enterCoId;
   R best;
   R bestCo;

   best = 0;
   bestCo = 0;
   last = 1.0;

   // avoid uninitialized value later on in entered4X()
   last = 1.0;

   if(this->thesolver->hyperPricingEnter && !refined)
   {
      if(bestPrices.size() < 2 || this->thesolver->basis().lastUpdate() == 0)
         enterCoId = (this->thesolver->sparsePricingEnter) ? buildBestPriceVectorEnterDim(best,
                     tol) : selectEnterDenseDim(best, tol);
      else
         enterCoId = (this->thesolver->sparsePricingEnter) ? selectEnterHyperDim(best,
                     tol) : selectEnterDenseDim(best, tol);

      if(bestPricesCo.size() < 2 || this->thesolver->basis().lastUpdate() == 0)
         enterId = (this->thesolver->sparsePricingEnterCo) ? buildBestPriceVectorEnterCoDim(bestCo,
                   tol) : selectEnterDenseCoDim(bestCo, tol);
      else
         enterId = (this->thesolver->sparsePricingEnterCo) ? selectEnterHyperCoDim(bestCo,
                   tol) : selectEnterDenseCoDim(bestCo, tol);
   }
   else
   {
      enterCoId = (this->thesolver->sparsePricingEnter
                   && !refined) ? selectEnterSparseDim(best, tol) : selectEnterDenseDim(best, tol);
      enterId = (this->thesolver->sparsePricingEnterCo
                 && !refined) ? selectEnterSparseCoDim(bestCo, tol) : selectEnterDenseCoDim(bestCo, tol);
   }

   // prefer coIds to increase the number of unit vectors in the basis matrix, i.e., rows in colrep and cols in rowrep
   if(enterCoId.isValid() && (best > SOPLEX_SPARSITY_TRADEOFF * bestCo || !enterId.isValid()))
      return enterCoId;
   else
      return enterId;
}